

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

bool pstore::command_line::details::handler_set_value
               (maybe<pstore::command_line::option_*,_void> *handler,string *value)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  option **ppoVar4;
  maybe<pstore::command_line::option_*,_void> local_30;
  string *local_20;
  string *value_local;
  maybe<pstore::command_line::option_*,_void> *handler_local;
  
  local_20 = value;
  value_local = (string *)handler;
  maybe<pstore::command_line::option_*,_void>::maybe(&local_30,handler);
  bVar1 = handler_takes_argument(&local_30);
  if (!bVar1) {
    assert_failed("handler_takes_argument (handler)",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/command_line.cpp"
                  ,0x55);
  }
  maybe<pstore::command_line::option_*,_void>::~maybe(&local_30);
  ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*(handler);
  uVar2 = (*(*ppoVar4)->_vptr_option[0x10])();
  if ((uVar2 & 1) == 0) {
    handler_local._7_1_ = false;
  }
  else {
    ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator*(handler);
    iVar3 = (*(*ppoVar4)->_vptr_option[0xf])(*ppoVar4,local_20);
    handler_local._7_1_ = (bool)((byte)iVar3 & 1);
  }
  return handler_local._7_1_;
}

Assistant:

bool handler_set_value (maybe<option *> handler, std::string const & value) {
                    PSTORE_ASSERT (handler_takes_argument (handler));
                    if (!(*handler)->add_occurrence ()) {
                        return false;
                    }
                    return (*handler)->value (value);
                }